

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O2

int __thiscall
Rml::ElementUtilities::GetStringWidth
          (ElementUtilities *this,Element *element,StringView string,Character prior_character)

{
  int iVar1;
  ComputedValues *this_00;
  FontFaceHandle FVar2;
  FontEngineInterface *pFVar3;
  TextShapingContext text_shaping_context;
  String *local_30;
  byte local_28;
  float local_24;
  
  this_00 = Element::GetComputedValues((Element *)this);
  local_30 = &(this_00->inherited).language;
  local_28 = (byte)((uint)*(undefined4 *)&(this_00->inherited).field_0x14 >> 0x1d) & 3;
  local_24 = Style::ComputedValues::letter_spacing(this_00);
  FVar2 = Element::GetFontFaceHandle((Element *)this);
  if (FVar2 == 0) {
    iVar1 = 0;
  }
  else {
    pFVar3 = GetFontEngineInterface();
    iVar1 = (*pFVar3->_vptr_FontEngineInterface[9])
                      (pFVar3,FVar2,element,string.p_begin,&local_30,(ulong)(uint)string.p_end);
  }
  return iVar1;
}

Assistant:

int ElementUtilities::GetStringWidth(Element* element, StringView string, Character prior_character)
{
	const auto& computed = element->GetComputedValues();
	const TextShapingContext text_shaping_context{computed.language(), computed.direction(), computed.letter_spacing()};

	FontFaceHandle font_face_handle = element->GetFontFaceHandle();
	if (font_face_handle == 0)
		return 0;

	return GetFontEngineInterface()->GetStringWidth(font_face_handle, string, text_shaping_context, prior_character);
}